

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayFill(InternalAnalyzer *this,ArrayFill *curr)

{
  EffectAnalyzer *pEVar1;
  bool bVar2;
  
  bVar2 = wasm::Type::isNull(&curr->ref->type);
  pEVar1 = this->parent;
  if (bVar2) {
    pEVar1->trap = true;
  }
  else {
    pEVar1->writesArray = true;
    pEVar1->implicitTrap = true;
  }
  return;
}

Assistant:

void visitArrayFill(ArrayFill* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.writesArray = true;
      // Traps when the destination is null or when out of bounds.
      parent.implicitTrap = true;
    }